

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whalesay.cpp
# Opt level: O3

string * __thiscall
Whale::Say_abi_cxx11_
          (string *__return_storage_ptr__,Whale *this,shared_ptr<IMessageHolder> *message)

{
  int iVar1;
  ostream *poVar2;
  stringstream ss;
  char local_1d1;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  iVar1 = (*((message->super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_IMessageHolder[1])();
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,(char)iVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,local_1c8)
  ;
  local_1d1 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1d1,1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"< ",2);
  (**((message->super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
     _vptr_IMessageHolder)(&local_1d0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,local_1c8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," >",2);
  local_1d1 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1d1,1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,(char)iVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,local_1c8)
  ;
  local_1d1 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1d1,1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"    \\",5);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"     \\",6);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"      \\",7);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"       \\                     .",0x1e);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"                             ==",0x1f);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"                            ===",0x1f);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"       /\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"___/ ===",0x20);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"  ~~~ {~~ ~~~~ ~~~ ~~~~ ~~ ~ /  ===- ~~~",0x28);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"       \\______ o          __/",0x1d);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"        \\    \\        __/",0x19);
  local_1d0._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"          \\____\\______/",0x17);
  local_1d0 = (long *)CONCAT71(local_1d0._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string Whale::Say(std::shared_ptr<IMessageHolder> message)
{
    std::stringstream ss;
    size_t length = message->GetLength();
	ss << " " << string(length,'_') << '\n';
	ss << "< " << message->GetMessage() << " >" << '\n';
	ss << " " << string(length,'_') << '\n';
	ss << "    \\" << '\n';
	ss << "     \\" << '\n';
	ss << "      \\" << '\n';
	ss << "       \\                     ." << '\n';
	ss << "                             ==" << '\n';
	ss << "                            ===" << '\n';
	ss << "       /\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"___/ ===" << '\n';
	ss << "  ~~~ {~~ ~~~~ ~~~ ~~~~ ~~ ~ /  ===- ~~~" << '\n';
	ss << "       \\______ o          __/" << '\n';
	ss << "        \\    \\        __/" << '\n';
	ss << "          \\____\\______/" << '\n';

    return ss.str();
}